

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrCreateSpatialAnchorsCompletionML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  PFN_xrResultToString p_Var2;
  bool bVar3;
  XrInstance pXVar4;
  ostream *poVar5;
  invalid_argument *this;
  string futureresult_prefix;
  string type_prefix;
  string spaces_prefix;
  string spacecount_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  ostringstream oss_spaceCount;
  ostringstream oss_spaces;
  uint auStack_190 [88];
  
  PointerToHexString<XrCreateSpatialAnchorsCompletionML>
            ((XrCreateSpatialAnchorsCompletionML *)futureresult_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_spaceCount);
  std::__cxx11::string::~string((string *)&oss_spaceCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_spaceCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_spaceCount)
    ;
    std::__cxx11::string::~string((string *)&oss_spaceCount);
  }
  else {
    _oss_spaceCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,(char *)&oss_spaceCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_spaceCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_348,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  std::__cxx11::string::~string((string *)&local_348);
  if (bVar3) {
    std::__cxx11::string::string((string *)&futureresult_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&futureresult_prefix);
    if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
      std::__cxx11::to_string((string *)&oss_spaceCount,value->futureResult);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&futureresult_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_spaceCount);
      std::__cxx11::string::~string((string *)&oss_spaceCount);
    }
    else {
      _oss_spaceCount = (pointer)0x0;
      p_Var2 = gen_dispatch_table->ResultToString;
      pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
      (*p_Var2)(pXVar4,value->futureResult,(char *)&oss_spaceCount);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&futureresult_prefix,
                 (char (*) [64])&oss_spaceCount);
    }
    std::__cxx11::string::string((string *)&spacecount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&spacecount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_spaceCount);
    poVar5 = std::operator<<((ostream *)&oss_spaceCount,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&spacecount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_spaces);
    std::__cxx11::string::~string((string *)&oss_spaces);
    std::__cxx11::string::string((string *)&spaces_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&spaces_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_spaces);
    *(uint *)((long)auStack_190 + *(long *)(_oss_spaces + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_oss_spaces + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_spaces);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])0x210f17,&spaces_prefix,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_spaces);
    std::__cxx11::string::~string((string *)&spaces_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_spaceCount);
    std::__cxx11::string::~string((string *)&spacecount_prefix);
    std::__cxx11::string::~string((string *)&futureresult_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCreateSpatialAnchorsCompletionML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string futureresult_prefix = prefix;
        futureresult_prefix += "futureResult";
        if (nullptr != gen_dispatch_table) {
            char futureResult_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->futureResult, futureResult_string);
            contents.emplace_back("XrResult", futureresult_prefix, futureResult_string);
        } else {
                        contents.emplace_back("XrResult", futureresult_prefix, std::to_string(value->futureResult));
        }
        std::string spacecount_prefix = prefix;
        spacecount_prefix += "spaceCount";
        std::ostringstream oss_spaceCount;
        oss_spaceCount << "0x" << std::hex << (value->spaceCount);
        contents.emplace_back("uint32_t", spacecount_prefix, oss_spaceCount.str());
        std::string spaces_prefix = prefix;
        spaces_prefix += "spaces";
        std::ostringstream oss_spaces;
        oss_spaces << std::hex << reinterpret_cast<const void*>(value->spaces);
        contents.emplace_back("XrSpace*", spaces_prefix, oss_spaces.str());
        return true;
    } catch(...) {
    }
    return false;
}